

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::_::concat<kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
          (String *__return_storage_ptr__,_ *this,CappedArray<char,_14UL> *params,
          ArrayPtr<const_char> *params_1,ArrayPtr<const_char> *params_2)

{
  size_t sVar1;
  char *__dest;
  
  heapString(__return_storage_ptr__,*(long *)params->content + *(long *)this + params_1->size_);
  __dest = (char *)(__return_storage_ptr__->content).size_;
  if (__dest != (char *)0x0) {
    __dest = (__return_storage_ptr__->content).ptr;
  }
  sVar1 = *(size_t *)this;
  if (sVar1 != 0) {
    memcpy(__dest,this + 8,sVar1);
    __dest = __dest + sVar1;
  }
  sVar1 = *(size_t *)params->content;
  if (sVar1 != 0) {
    memcpy(__dest,(void *)params->currentSize,sVar1);
    __dest = __dest + sVar1;
  }
  if (params_1->size_ != 0) {
    memcpy(__dest,params_1->ptr,params_1->size_);
  }
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}